

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcObject::~IfcObject(IfcObject *this)

{
  undefined8 *puVar1;
  long *plVar2;
  
  puVar1 = (undefined8 *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18));
  plVar2 = (long *)(&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>).field_0x20
                   + *(long *)(*(long *)this + -0x18));
  plVar2[-0x17] = (long)&PTR__IfcObject_007ee170;
  plVar2[3] = (long)&PTR__IfcObject_007ee1e8;
  plVar2[-6] = (long)&PTR__IfcObject_007ee198;
  plVar2[-4] = (long)&PTR__IfcObject_007ee1c0;
  if ((long *)plVar2[-2] != plVar2) {
    operator_delete((long *)plVar2[-2],*plVar2 + 1);
  }
  *puVar1 = 0x7ee300;
  puVar1[0x1a] = 0x7ee328;
  if ((long *)puVar1[0xc] != puVar1 + 0xe) {
    operator_delete((long *)puVar1[0xc],puVar1[0xe] + 1);
  }
  if ((long *)puVar1[7] != puVar1 + 9) {
    operator_delete((long *)puVar1[7],puVar1[9] + 1);
  }
  if ((long *)puVar1[2] != puVar1 + 4) {
    operator_delete((long *)puVar1[2],puVar1[4] + 1);
  }
  operator_delete(puVar1,0xe8);
  return;
}

Assistant:

IfcObject() : Object("IfcObject") {}